

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O3

uintm __thiscall PcodeOp::getCseHash(PcodeOp *this)

{
  pointer ppVVar1;
  Varnode *pVVar2;
  OpCode OVar3;
  long lVar4;
  long lVar5;
  OpCode OVar6;
  
  OVar3 = 0;
  if (((this->flags & 0x18000) != 0) &&
     (OVar6 = this->opcode->opcode, OVar3 = 0, OVar6 != CPUI_COPY)) {
    ppVVar1 = (this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    OVar3 = this->output->size << 8 | OVar6;
    lVar4 = (long)(this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppVVar1;
    if (lVar4 != 0) {
      lVar4 = lVar4 >> 3;
      lVar5 = 0;
      do {
        pVVar2 = ppVVar1[lVar5];
        if ((pVVar2->flags & 2) == 0) {
          OVar6 = pVVar2->create_index;
        }
        else {
          OVar6 = (OpCode)(pVVar2->loc).offset;
        }
        OVar3 = (OVar3 << 8 | OVar3 >> 0x18) ^ OVar6;
        lVar5 = lVar5 + 1;
      } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
    }
  }
  return OVar3;
}

Assistant:

uintm PcodeOp::getCseHash(void) const

{
  uintm hash;
  if ((getEvalType()&(PcodeOp::unary|PcodeOp::binary))==0) return ((uintm)0);
  if (code()==CPUI_COPY) return ((uintm)0); // Let copy propagation deal with this
  
  hash = (output->getSize()<<8) | (uintm)code();
  for(int4 i=0;i<inrefs.size();++i) {
    const Varnode *vn = getIn(i);
    hash = (hash<<8) | (hash>>(sizeof(uintm)*8-8));
    if (vn->isConstant())
      hash ^= (uintm)vn->getOffset();
    else
      hash ^= (uintm)vn->getCreateIndex(); // Hash in pointer itself as unique id
  }
  return hash;
}